

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3MemRealloc(void *pPrior,int nByte)

{
  uint uVar1;
  long *local_20;
  sqlite3_int64 *p;
  int nByte_local;
  void *pPrior_local;
  
  local_20 = (long *)realloc((void *)((long)pPrior + -8),(long)(nByte + 8));
  if (local_20 == (long *)0x0) {
    uVar1 = sqlite3MemSize(pPrior);
    sqlite3_log(7,"failed memory resize %u to %u bytes",(ulong)uVar1,(ulong)(uint)nByte);
    local_20 = (long *)0x0;
  }
  else {
    *local_20 = (long)nByte;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

static void *sqlite3MemRealloc(void *pPrior, int nByte){
#ifdef SQLITE_MALLOCSIZE
  void *p = SQLITE_REALLOC(pPrior, nByte);
  if( p==0 ){
    testcase( sqlite3GlobalConfig.xLog!=0 );
    sqlite3_log(SQLITE_NOMEM,
      "failed memory resize %u to %u bytes",
      SQLITE_MALLOCSIZE(pPrior), nByte);
  }
  return p;
#else
  sqlite3_int64 *p = (sqlite3_int64*)pPrior;
  assert( pPrior!=0 && nByte>0 );
  assert( nByte==ROUND8(nByte) ); /* EV: R-46199-30249 */
  p--;
  p = SQLITE_REALLOC(p, nByte+8 );
  if( p ){
    p[0] = nByte;
    p++;
  }else{
    testcase( sqlite3GlobalConfig.xLog!=0 );
    sqlite3_log(SQLITE_NOMEM,
      "failed memory resize %u to %u bytes",
      sqlite3MemSize(pPrior), nByte);
  }
  return (void*)p;
#endif
}